

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O0

int opus_picture_tag_parse(OpusPictureTag *_pic,char *_tag)

{
  int iVar1;
  size_t sVar2;
  uchar *_buf;
  int ret;
  size_t tag_length;
  size_t buf_sz;
  size_t base64_sz;
  uchar *buf;
  OpusPictureTag pic;
  char *_tag_local;
  OpusPictureTag *_pic_local;
  
  pic._56_8_ = _tag;
  iVar1 = opus_tagncompare("METADATA_BLOCK_PICTURE",0x16,_tag);
  if (iVar1 == 0) {
    pic._56_8_ = pic._56_8_ + 0x17;
  }
  sVar2 = strlen((char *)pic._56_8_);
  if ((sVar2 & 3) == 0) {
    tag_length = (sVar2 >> 2) * 3;
    if (tag_length < 0x20) {
      _pic_local._4_4_ = -0x84;
    }
    else {
      if (*(char *)(pic._56_8_ + (sVar2 - 1)) == '=') {
        tag_length = tag_length - 1;
      }
      if (*(char *)(pic._56_8_ + (sVar2 - 2)) == '=') {
        tag_length = tag_length - 1;
      }
      if (tag_length < 0x20) {
        _pic_local._4_4_ = -0x84;
      }
      else {
        _buf = (uchar *)malloc(tag_length + 1);
        if (_buf == (uchar *)0x0) {
          _pic_local._4_4_ = -0x81;
        }
        else {
          opus_picture_tag_init((OpusPictureTag *)&buf);
          _pic_local._4_4_ =
               opus_picture_tag_parse_impl
                         ((OpusPictureTag *)&buf,(char *)pic._56_8_,_buf,tag_length,sVar2 >> 2);
          if (_pic_local._4_4_ < 0) {
            opus_picture_tag_clear((OpusPictureTag *)&buf);
            free(_buf);
          }
          else {
            memcpy(_pic,&buf,0x40);
          }
        }
      }
    }
  }
  else {
    _pic_local._4_4_ = -0x84;
  }
  return _pic_local._4_4_;
}

Assistant:

int opus_picture_tag_parse(OpusPictureTag *_pic,const char *_tag){
  OpusPictureTag  pic;
  unsigned char  *buf;
  size_t          base64_sz;
  size_t          buf_sz;
  size_t          tag_length;
  int             ret;
  if(opus_tagncompare("METADATA_BLOCK_PICTURE",22,_tag)==0)_tag+=23;
  /*Figure out how much BASE64-encoded data we have.*/
  tag_length=strlen(_tag);
  if(tag_length&3)return OP_ENOTFORMAT;
  base64_sz=tag_length>>2;
  buf_sz=3*base64_sz;
  if(buf_sz<32)return OP_ENOTFORMAT;
  if(_tag[tag_length-1]=='=')buf_sz--;
  if(_tag[tag_length-2]=='=')buf_sz--;
  if(buf_sz<32)return OP_ENOTFORMAT;
  /*Allocate an extra byte to allow appending a terminating NUL to URL data.*/
  buf=(unsigned char *)_ogg_malloc(sizeof(*buf)*(buf_sz+1));
  if(buf==NULL)return OP_EFAULT;
  opus_picture_tag_init(&pic);
  ret=opus_picture_tag_parse_impl(&pic,_tag,buf,buf_sz,base64_sz);
  if(ret<0){
    opus_picture_tag_clear(&pic);
    _ogg_free(buf);
  }
  else *_pic=*&pic;
  return ret;
}